

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_aggregate_optimizer.cpp
# Opt level: O2

void __thiscall
duckdb::CommonAggregateOptimizer::VisitOperator(CommonAggregateOptimizer *this,LogicalOperator *op)

{
  LogicalAggregate *aggr;
  uint uVar1;
  CommonAggregateOptimizer common_aggregate;
  CommonAggregateOptimizer local_50;
  
  uVar1 = op->type - 0x4b;
  if (((uVar1 < 5) && (uVar1 != 3)) || (op->type == LOGICAL_PROJECTION)) {
    local_50.aggregate_map._M_h._M_buckets = &local_50.aggregate_map._M_h._M_single_bucket;
    local_50.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         (_func_int **)&PTR__CommonAggregateOptimizer_027aa188;
    local_50.aggregate_map._M_h._M_bucket_count = 1;
    local_50.aggregate_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_50.aggregate_map._M_h._M_element_count = 0;
    local_50.aggregate_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_50.aggregate_map._M_h._M_rehash_policy._M_next_resize = 0;
    local_50.aggregate_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    StandardVisitOperator(&local_50,op);
    ~CommonAggregateOptimizer(&local_50);
  }
  else {
    StandardVisitOperator(this,op);
    if (op->type == LOGICAL_AGGREGATE_AND_GROUP_BY) {
      aggr = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
      ExtractCommonAggregates(this,aggr);
      return;
    }
  }
  return;
}

Assistant:

void CommonAggregateOptimizer::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		CommonAggregateOptimizer common_aggregate;
		common_aggregate.StandardVisitOperator(op);
		return;
	}
	default:
		break;
	}

	StandardVisitOperator(op);
	if (op.type == LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY) {
		ExtractCommonAggregates(op.Cast<LogicalAggregate>());
	}
}